

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifyMathematicalExpressions.cpp
# Opt level: O2

bool isNumber(string *input)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (input->_M_string_length == uVar3) break;
    iVar2 = (int)(input->_M_dataplus)._M_p[uVar3];
    uVar1 = uVar3 + 1;
  } while (iVar2 - 0x30U < 10 || iVar2 == 0x2e);
  return input->_M_string_length <= uVar3;
}

Assistant:

bool isNumber(std::string input) {
    for (int i = 0; i < input.size(); ++i) {
        if(!std::isdigit(input[i])){
            if(input[i] == '.'){
                continue;
            }
            return false;
        }
    }
    return true;
}